

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

UText * utext_close_63(UText *ut)

{
  UTextClose *pUVar1;
  uint uVar2;
  uint uVar3;
  
  if (ut != (UText *)0x0) {
    if (ut->magic != 0x345ad82c) {
      return ut;
    }
    uVar2 = ut->flags;
    if ((uVar2 & 4) == 0) {
      return ut;
    }
    pUVar1 = ut->pFuncs->close;
    if (pUVar1 != (UTextClose *)0x0) {
      (*pUVar1)(ut);
      uVar2 = ut->flags;
    }
    uVar3 = uVar2 & 0xfffffffb;
    ut->flags = uVar3;
    if ((uVar2 & 2) != 0) {
      uprv_free_63(ut->pExtra);
      ut->pExtra = (void *)0x0;
      uVar3 = ut->flags & 0xfffffffd;
      ut->flags = uVar3;
      ut->extraSize = 0;
    }
    ut->pFuncs = (UTextFuncs *)0x0;
    if ((uVar3 & 1) == 0) {
      return ut;
    }
    ut->magic = 0;
    uprv_free_63(ut);
  }
  return (UText *)0x0;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_close(UText *ut) {
    if (ut==NULL ||
        ut->magic != UTEXT_MAGIC ||
        (ut->flags & UTEXT_OPEN) == 0)
    {
        // The supplied ut is not an open UText.
        // Do nothing.
        return ut;
    }

    // If the provider gave us a close function, call it now.
    // This will clean up anything allocated specifically by the provider.
    if (ut->pFuncs->close != NULL) {
        ut->pFuncs->close(ut);
    }
    ut->flags &= ~UTEXT_OPEN;

    // If we (the framework) allocated the UText or subsidiary storage,
    //   delete it.
    if (ut->flags & UTEXT_EXTRA_HEAP_ALLOCATED) {
        uprv_free(ut->pExtra);
        ut->pExtra = NULL;
        ut->flags &= ~UTEXT_EXTRA_HEAP_ALLOCATED;
        ut->extraSize = 0;
    }

    // Zero out function table of the closed UText.  This is a defensive move,
    //   inteded to cause applications that inadvertantly use a closed
    //   utext to crash with null pointer errors.
    ut->pFuncs        = NULL;

    if (ut->flags & UTEXT_HEAP_ALLOCATED) {
        // This UText was allocated by UText setup.  We need to free it.
        // Clear magic, so we can detect if the user messes up and immediately
        //  tries to reopen another UText using the deleted storage.
        ut->magic = 0;
        uprv_free(ut);
        ut = NULL;
    }
    return ut;
}